

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O0

CURLcode pop3_parse_custom_request(Curl_easy *data)

{
  char *string;
  char *custom;
  POP3 *pop3;
  CURLcode result;
  Curl_easy *data_local;
  
  pop3._4_4_ = CURLE_OK;
  string = (data->set).str[0x1c];
  if (string != (char *)0x0) {
    pop3._4_4_ = Curl_urldecode(string,0,&((data->req).p.imap)->uidvalidity,(size_t *)0x0,
                                REJECT_CTRL);
  }
  return pop3._4_4_;
}

Assistant:

static CURLcode pop3_parse_custom_request(struct Curl_easy *data)
{
  CURLcode result = CURLE_OK;
  struct POP3 *pop3 = data->req.p.pop3;
  const char *custom = data->set.str[STRING_CUSTOMREQUEST];

  /* URL decode the custom request */
  if(custom)
    result = Curl_urldecode(custom, 0, &pop3->custom, NULL, REJECT_CTRL);

  return result;
}